

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_XXX.cpp
# Opt level: O2

void __thiscall EnvironmentXXX::CreateStartandGoalStates(EnvironmentXXX *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar1 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x21])
                    (this,0,0,0,0);
  (this->EnvXXX).startstateid = *(int *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x21])
                    (this,1,1,1,1);
  (this->EnvXXX).goalstateid = *(int *)CONCAT44(extraout_var_00,iVar1);
  return;
}

Assistant:

void EnvironmentXXX::CreateStartandGoalStates()
{
    EnvXXXHashEntry_t* HashEntry;

    //create start state
    unsigned int X1 = 0;
    unsigned int X2 = 0;
    unsigned int X3 = 0;
    unsigned int X4 = 0;
    HashEntry = CreateNewHashEntry(X1, X2, X3, X4);
    EnvXXX.startstateid = HashEntry->stateID;

    //create goal state
    X1 = X2 = X3 = X4 = 1;
    HashEntry = CreateNewHashEntry(X1, X2, X3, X4);
    EnvXXX.goalstateid = HashEntry->stateID;
}